

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetPropertyFromDescriptor<true>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,
          Var *value,PropertyValueInfo *info)

{
  Var pvVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  PropertyValueInfo *info_local;
  Var *value_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  if ((descriptor->Attributes & 8) == 0) {
    if (descriptor->propertyIndex == 0xffff) {
      this_00 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
      pRVar2 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      *value = pRVar2;
    }
    else {
      pvVar1 = DynamicObject::GetSlot(instance,(uint)descriptor->propertyIndex);
      *value = pvVar1;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,descriptor);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyFromDescriptor(DynamicObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var* value, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & (PropertyDeleted | (allowLetConstGlobal ? 0 : PropertyLetConstGlobal)))
        {
            return false;
        }
        if (descriptor->propertyIndex != NoSlots)
        {
            *value = instance->GetSlot(descriptor->propertyIndex);
            SetPropertyValueInfo(info, instance, descriptor);
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
        }
        return true;
    }